

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

void adjust_cost(AV1_COMP *cpi,MACROBLOCK *x,int64_t *rd_cost)

{
  int iVar1;
  int64_t *in_R8;
  int64_t rec_var;
  int64_t src_var;
  long local_38;
  long local_30;
  
  if ((cpi->oxcf).algo_cfg.sharpness == 3) {
    iVar1 = frame_is_kf_gf_arf(cpi);
    if (iVar1 == 0) {
      get_variance_stats(cpi,x,(int)&local_30,&local_38,in_R8);
      if (local_30 - local_38 != 0 && local_38 <= local_30) {
        *rd_cost = *rd_cost + (local_30 - local_38) * 0x80;
      }
    }
  }
  return;
}

Assistant:

static void adjust_cost(const AV1_COMP *cpi, const MACROBLOCK *x,
                        int64_t *rd_cost) {
  if (cpi->oxcf.algo_cfg.sharpness != 3) return;

  if (frame_is_kf_gf_arf(cpi)) return;

  int64_t src_var, rec_var;
  get_variance_stats(cpi, x, 1, &src_var, &rec_var);

  if (src_var <= rec_var) return;

  int64_t var_offset = src_var - rec_var;

  *rd_cost += RDCOST(x->rdmult, 0, var_offset);
}